

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O2

EC_T_CHAR * SlaveVendorText(T_eEtherCAT_Vendor EV)

{
  bool bVar1;
  char *pcVar2;
  T_eEtherCAT_Vendor TVar3;
  
  pcVar2 = "KNESTEL Technologie & Elektronik GmbH (Hardware/Product Development)";
  TVar3 = EV;
  do {
    switch(TVar3) {
    case ecvendor_beck_ipc:
      return "Beck IPC GmbH";
    case ecvendor_etas:
      return "ETAS GmbH";
    case ecvendor_etas|ecvendor_etg:
    case ecvendor_fh_koeln|ecvendor_etg:
    case 0x510:
    case ecvendor_moog_italiana|ecvendor_etg:
    case ecvendor_ritter_elektronik|ecvendor_etg:
    case ecvendor_ritter_elektronik|ecvendor_beckhoff:
    case ecvendor_dresdenelektronik|ecvendor_etg:
    case ecvendor_dresdenelektronik|ecvendor_beckhoff:
    case ecvendor_dresdenelektronik|ecvendor_scuola_superiore_s_anna:
    case ecvendor_arm_automation|ecvendor_etg:
    case ecvendor_arm_automation|ecvendor_beckhoff:
    case ecvendor_nittetsu_elex|ecvendor_etg:
    case ecvendor_scansonic|ecvendor_ixxat:
    case ecvendor_scansonic|ecvendor_knestel:
    case ecvendor_industrial_control_communications|ecvendor_etg:
    case ecvendor_tata_consultancy|ecvendor_etg:
    case ecvendor_switched_reluctance|ecvendor_etg:
    case 0x568:
    case ecvendor_abb_power_systems|ecvendor_ixxat:
    case ecvendor_abb_power_systems|ecvendor_vector_informatik:
    case 0x578:
    case ecvendor_lintec|ecvendor_beckhoff:
    case ecvendor_lintec|ecvendor_scuola_superiore_s_anna:
    case 0x580:
    case ecvendor_staeubli_faverges|ecvendor_beckhoff:
    case ecvendor_schweitzer_engineering_labs|ecvendor_etg:
    case ecvendor_muehlbauer|ecvendor_etg:
    case ecvendor_muehlbauer|ecvendor_ixxat:
    case ecvendor_ingeteam|ecvendor_etg:
    case 0x5a0:
    case 0x5a1:
    case 0x5a2:
    case 0x5a3:
    case 0x5a4:
    case 0x5a5:
    case 0x5a6:
    case 0x5a7:
    case 0x5a8:
    case 0x5a9:
    case 0x5aa:
    case 0x5ab:
    case 0x5ac:
    case 0x5ad:
    case 0x5ae:
    case 0x5af:
    case 0x5b0:
    case 0x5b1:
    case 0x5b2:
    case 0x5b3:
    case 0x5b4:
    case 0x5b5:
    case 0x5b6:
    case 0x5b7:
    case 0x5b8:
    case 0x5b9:
    case 0x5ba:
    case 0x5bb:
    case 0x5bc:
    case 0x5bd:
    case 0x5be:
    case 0x5bf:
    case 0x5c0:
    case 0x5c1:
    case 0x5c2:
    case 0x5c3:
    case 0x5c4:
    case 0x5c5:
    case 0x5c6:
    case 0x5c7:
    case 0x5c8:
    case 0x5c9:
    case 0x5ca:
    case 0x5cb:
    case 0x5cc:
    case 0x5cd:
    case 0x5ce:
    case 0x5cf:
    case 0x5d0:
    case 0x5d1:
    case 0x5d2:
    case 0x5d3:
    case 0x5d4:
    case 0x5d5:
    case 0x5d6:
    case 0x5d7:
    case 0x5d8:
    case 0x5d9:
    case 0x5da:
    case 0x5db:
    case 0x5dc:
    case 0x5dd:
    case 0x5de:
    case 0x5df:
    case 0x5e0:
    case 0x5e1:
    case 0x5e2:
    case 0x5e3:
    case 0x5e4:
    case 0x5e5:
    case 0x5e6:
    case 0x5e7:
    case 0x5e8:
    case 0x5e9:
    case 0x5ea:
    case 0x5eb:
    case 0x5ec:
    case 0x5ed:
    case 0x5ee:
    case 0x5ef:
    case 0x5f0:
    case 0x5f1:
    case 0x5f2:
    case 0x5f3:
    case 0x5f4:
    case 0x5f5:
    case 0x5f6:
    case 0x5f7:
    case 0x5f8:
    case 0x5f9:
    case 0x5fa:
    case 0x5fb:
    case 0x5fc:
    case 0x5fd:
    case 0x5fe:
    case 0x5ff:
      goto switchD_00147e87_caseD_19f;
    case ecvendor_phytec_messtechnik:
      return "PHYTEC Messtechnik GmbH";
    case ecvendor_anca_motion:
      return "ANCA Motion Pty. Ltd";
    case ecvendor_fh_koeln:
      return "Fachhochschule Koeln (IME-RT)";
    case ecvendor_nuvation_research:
      return "Nuvation Research Corporation";
    case ecvendor_tr:
      return "TR-Electronic";
    case ecvendor_gantner:
      return "Gantner Instruments GmbH";
    case ecvendor_mks_systems:
      return "MKS Instruments (CIT Controls)";
    case ecvendor_abb_robotics:
      return "ABB AB (Robotics)";
    case ecvendor_unitro_fleischmann:
      return "Unitro-Fleischmann";
    case ecvendor_zub_machine_control:
      return "zub machine control AG";
    case ecvendor_dspace:
      return "dSPACE GmbH";
    case ecvendor_samsung:
      return "Samsung Heavy Industries (Mechatronics Center)";
    case ecvendor_bce:
      return "BCE Elektronik GmbH";
    case ecvendor_jaeger_messtechnik:
      return "Jaeger Computergesteuerte Messtechnik GmbH";
    case ecvendor_tetra:
      return "TETRA Gesellschaft fuer Sensorik, Robotik und Automation mbH";
    case ecvendor_justek:
      return "Justek Inc. (Research Lab.)";
    case ecvendor_baumer_thalheim:
      return "Baumer Thalheim GmbH & Co. KG";
    case ecvendor_elin_ebg_traction:
      return "Elin EBG Traction GmbH";
    case ecvendor_meka_robotics:
      return "Meka Robotics";
    case ecvendor_altera_japan:
      return "Altera Japan Ltd.";
    case ecvendor_ebv_elektronik:
      return "EBV Elektronik GmbH & Co. KG";
    case ecvendor_igh:
      return "Ingenieurgemeinschaft IgH";
    case ecvendor_iav:
      return "IAV GmbH (MD-E4)";
    case ecvendor_hitachi:
      return "Hitachi Industrial Equipment Systems";
    case ecvendor_tenasys:
      return "TenAsys Corp. (INtime)";
    case ecvendor_pondis:
      return "PONDis AG";
    case ecvendor_moog_italiana:
      return "Moog Italiana S.r.l. (Casella)";
    case ecvendor_wallner_automation:
      return "Wallner Automation";
    case ecvendor_avl_list:
      return "AVL List GmbH (PECE)";
    case ecvendor_ritter_elektronik:
      return "RITTER-Elektronik GmbH";
    case ecvendor_zwick:
      return "Zwick GmbH & Co. KG";
    case ecvendor_dresdenelektronik:
      return "dresden elektronik ingenieurtechnik gmbh";
    case ecvendor_philips_healthcare:
      return "Philips Healthcare (CT Division)";
    case ecvendor_chess:
      return "Chess B.V.";
    case ecvendor_nct:
      return "NCT kft";
    case ecvendor_anywire:
      return "Anywire Corporation";
    case ecvendor_shadow_robot:
      return "Shadow Robot Company Ltd.";
    case ecvendor_fecon:
      return "FeCon GmbH";
    case ecvendor_fh_suedwestfahlen:
      return "FH Suedwestfalen (LaborEV)";
    case ecvendor_add2:
      return "add2 Ldt";
    case ecvendor_arm_automation:
      return "ARM Automation, Inc.";
    case ecvendor_knapp_logistik:
      return "KNAPP Logistik Automation GmbH (KNAPP AG)";
    case ecvendor_getriebebau_nord:
      return "Getriebebau NORD GmbH & Co. KG";
    case ecvendor_yaskawa:
      return "Yaskawa Electric Corporation (Japan)";
    case ecvendor_oki:
      return "Oki Information Systems Co., Ltd. (Japan)";
    case ecvendor_takasaki_kyoudou:
      return "Takasaki Kyoudou Computing Center Co. (Multimedia and Audio Visual)";
    case ecvendor_nittetsu_elex:
      return "NITTETSU ELEX Co., Ltd. (FA-System)";
    case ecvendor_unjo:
      return "Unjo AB";
    case ecvendor_eads_deutschland:
      return "EADS Deutschland GmbH (Military Air Systems)";
    case ecvendor_acs_motion_control:
      return "ACS Motion Control Ltd.";
    case ecvendor_keyence:
      return "KEYENCE Corporation";
    case ecvendor_mefi:
      return "MEFI s.r.o.";
    case ecvendor_mut:
      return "m-u-t AG Messgeraete fuer Medizin- und Umwelttechnik";
    case ecvendor_isw_uni_stuttgart:
      return "ISW - Universitaet Stuttgart (Fachbereich C)";
    case ecvendor_elsena:
      return "ELSENA, Inc. (TOKYO)";
    case ecvendor_be_semiconductor:
      return "BE Semiconductor Industries N.V. (Datacon Technology GmbH)";
    case ecvendor_hauni_lni:
      return "Hauni LNI Electronics S.A. (R&D)";
    case ecvendor_etel:
      return "ETEL S.A. (Electronics R&D)";
    case ecvendor_vat_vakuumventile:
      return "VAT Vakuumventile AG";
    case ecvendor_laytec:
      return "LayTec GmbH (Research&Development)";
    case ecvendor_num:
      return "NUM AG";
    case ecvendor_hauni_maschinenbau:
      return "Hauni Maschinenbau AG";
    case ecvendor_exatronic:
      return "Exatronic, Engenharia Electronica, Lda";
    case ecvendor_iim_chinese_aos:
      return "Institute of Intelligent Machines, Chinese Academy of Sciences";
    case ecvendor_tu_eindhoven:
      return "Eindhoven University of Technology (Mechanical Engineering)";
    case ecvendor_scansonic:
      return "Scansonic MI GmbH";
    case ecvendor_shanghai_sodick_sw:
      return "Shanghai Sodick Software Co., Ltd.";
    case ecvendor_chuo_electronics:
      return "CHUO ELECTRONICS CO., LTD";
    case ecvendor_agie:
      return "AGIE SA";
    case ecvendor_hei_canton_de_vaud:
      return 
      "Haute Ecoled\'Ingenierie et de Gestion du Canton de Vaud (IAI - Institut d\'Automatisation Industrielle de la HEIG-VD)"
      ;
    case ecvendor_jenny_science:
      return "Jenny Science AG";
    case ecvendor_industrial_control_communications:
      return "Industrial Control Communications, Inc.";
    case ecvendor_ckd_elektrotechnika:
      return "CKD ELEKTROTECHNIKA, a.s. (Electrotechnics)";
    case ecvendor_qem:
      return "QEM S.r.l.";
    case ecvendor_simatex:
      return "Simatex AG (Software)";
    case ecvendor_kithara:
      return "Kithara Software GmbH";
    case ecvendor_converteam:
      return "Converteam GmbH";
    case ecvendor_ara:
      return "Ara apparatenfabriek B.V.";
    case ecvendor_tata_consultancy:
      return "Tata Consultancy Services Ltd. (Abhilash Embedded)";
    case ecvendor_tiab:
      return "Tiab Limited";
    case ecvendor_rkc_instrument:
      return "RKC INSTRUMENT INC.";
    case ecvendor_switched_reluctance:
      return "Switched Reluctance Drives Ltd. (Development)";
    case ecvendor_avnet_electronics:
      return "Avnet Electronics Marketing";
    case ecvendor_abb_force_measurement:
      return "ABB AB (Force Measurement)";
    case ecvendor_kunbus:
      return "KUNBUS GmbH";
    case ecvendor_acd_antriebstechnik:
      return "ACD Antriebstechnik GmbH";
    case ecvendor_bronkhorst:
      return "Bronkhorst High-Tech B.V.";
    case ecvendor_k_mecs:
      return "K.MECS Co., Ltd. (Engineering Dept.)";
    case ecvendor_thomson_broadcast:
      return "Thomson Broadcast & Multimedia AG";
    case ecvendor_ufg_elettronica:
      return "UFG Elettronica s.r.l. (Manufacturing)";
    case ecvendor_xilinx:
      return "Xilinx Ireland (Xilinx Design Services)";
    case ecvendor_abb_power_systems:
      return "ABB AB (Power Systems)";
    case ecvendor_servoland:
      return "Servoland Corporation";
    case ecvendor_hivertec:
      return "Hivertec, Inc.";
    case ecvendor_fike_europe:
      return "Fike Europe B.v.b.a.";
    case ecvendor_ropex:
      return "ROPEX Industrie-Elektronik GmbH";
    case ecvendor_tlu:
      return "TLU - Thueringer Leistungselektronik Union GmbH";
    case ecvendor_prodrive:
      return "Prodrive B.V.";
    case ecvendor_miho_inspektionssysteme:
      return "miho Inspektionssysteme GmbH";
    case ecvendor_tokyo_electron:
      return "Tokyo Electron Device Limited (PLD)";
    case ecvendor_lintec:
      return "LINTEC CO., LTD. (Design Division2)";
    case ecvendor_simplex_vision:
      return "Symplex Vision Systems GmbH";
    case ecvendor_sus:
      return "SUS Corporation";
    case ecvendor_trsystems:
      return "TRsystems GmbH (Systembereich Unidor)";
    case ecvendor_harmonic_drive:
      return "Harmonic Drive AG";
    case ecvendor_staeubli_faverges:
      return "Staeubli Faverges SCA (Robotics)";
    case ecvendor_scienlab_electronic:
      return "ScienLab electronic systems GmbH";
    case ecvendor_fujisoft:
      return "FUJISOFT Incorporated (Atsugi Office)";
    case ecvendor_iai_corporation:
      return "IAI Corporation";
    case ecvendor_promavtomatika:
      return "PromAvtomatika";
    case ecvendor_kistler_instrumente:
      return "Kistler Instrumente AG";
    case ecvendor_lauda_wobser:
      return "LAUDA DR. R. WOBSER GmbH & Co. KG (Development / Construction)";
    case ecvendor_schweitzer_engineering_labs:
      return "Schweitzer Engineering Laboratories, Inc.";
    case ecvendor_mutracx:
      return "Mutracx B.V.";
    case ecvendor_algo:
      return "Algo System Co., Ltd.";
    case ecvendor_muehlbauer:
      return "Muehlbauer AG (Construction of special-purpose machines)";
    case ecvendor_sealevel_systems:
      return "Sealevel Systems, Inc.";
    case ecvendor_igm_robotersysteme:
      return "igm Robotersysteme AG";
    case ecvendor_zbe:
      return "ZBE Inc.";
    case ecvendor_schneider_electric:
      return "Schneider Electric Power Drives GmbH";
    case ecvendor_fraunhofer_iosb_ina:
      return "Fraunhofer IOSB-INA Kompetenzzentrum Industrial Automation";
    case ecvendor_skf_magnetic_bearings:
      return "SKF Magnetic Bearings";
    case ecevndor_galil_motion_control:
      return "Galil Motion Control Inc.";
    case ecvendor_ihi:
      return "IHI Corporation (Yokohama Engineering Center)";
    case ecvendor_wenglor_sensoric:
      return "wenglor sensoric gmbh";
    case ecvendor_ingeteam:
      return "Ingeteam Technology S.A.";
    case ecvendor_micro_vu:
      return "Micro-Vu Corporation";
    case ecvendor_oehri_electronic:
      return "oehri electronic ag";
    case ecvendor_nagano_oki:
      return "Nagano Oki Electric Co., Ltd.";
    case ecvendor_condalo:
      return "Condalo GmbH";
    }
    switch(TVar3) {
    case ecvendor_etg:
      return "EtherCAT Technology Group";
    case ecvendor_beckhoff:
      return "Beckhoff Automation GmbH";
    case ecvendor_scuola_superiore_s_anna:
      return "Scuola Superiore S. Anna (PERCRO)";
    case ecvendor_ixxat:
      return "IXXAT Automation GmbH";
    case ecvendor_vector_informatik:
      return "Vector Informatik GmbH";
    case ecvendor_knestel:
      goto switchD_00147e6c_caseD_6;
    case ecvendor_knestel|ecvendor_etg:
    case 8:
    case 9:
    case ecvendor_cmz_sistemi|ecvendor_etg:
    case 0xc:
    case ecvendor_lust|ecvendor_etg:
    case ecvendor_lust|ecvendor_beckhoff:
    case ecvendor_keb|ecvendor_etg:
    case 0x18:
    case 0x19:
    case ecvendor_lust|ecvendor_cmz_sistemi:
    case ecvendor_epis_automation|ecvendor_beckhoff:
    case ecvendor_epis_automation|ecvendor_scuola_superiore_s_anna:
    case 0x20:
    case 0x22:
    case 0x23:
    case ecvendor_boschrexroth|ecvendor_etg:
    case ecvendor_boschrexroth|ecvendor_beckhoff:
    case ecvendor_boschrexroth|ecvendor_scuola_superiore_s_anna:
    case ecvendor_moog|ecvendor_etg:
    case ecvendor_moog|ecvendor_beckhoff:
    case ecvendor_moog|ecvendor_scuola_superiore_s_anna:
    case ecvendor_moog|ecvendor_ixxat:
    case ecvendor_moog|ecvendor_vector_informatik:
    case ecvendor_moog|ecvendor_knestel:
    case ecvendor_moog|ecvendor_knestel|ecvendor_etg:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case ecvendor_port|ecvendor_etg:
    case ecvendor_port|ecvendor_beckhoff:
    case ecvendor_port|ecvendor_scuola_superiore_s_anna:
    case 0x38:
    case 0x3a:
      break;
    case ecvendor_cmz_sistemi:
      return "CMZ Sistemi Elettronici";
    case ecvendor_softing:
      return "Softing AG";
    case ecvendor_microcontrol:
      return "MicroControl GmbH & Co. KG";
    case ecvendor_pollmeier:
      return "ESR Pollmeier";
    case ecvendor_lust:
      return "LTI Lust";
    case ecvendor_kuebler:
      return "Fritz Kuebler GmbH";
    case ecvendor_keb:
      return "KEB, Karl E. Brinkmann GmbH";
    case ecvendor_lti:
      return "LTi DRiVES GmbH";
    case ecvendor_esd_electronic_design:
      return "esd electronic system design gmbh";
    case ecvendor_hms_industrial_networks:
      return "HMS Industrial Networks AB";
    case ecvendor_epis_automation:
      return "epis Automation GmbH & Co. KG";
    case ecvendor_festo:
      return "Festo AG & Co, KG (TV-N)";
    case ecvendor_wago:
      return "WAGO Kontakttechnik GmbH & Co. KG";
    case ecvendor_boschrexroth:
      return "Bosch Rexroth AG";
    case ecvendor_moog:
      return "Moog GmbH";
    case ecvendor_port:
      return "port GmbH";
    case ecvendor_buerkert_werke:
      return "Buerkert Werke GmbH & Co. KG (Development)";
    case ecvendor_lenze:
      return "Lenze Drive Systems GmbH (Lenze AG)";
    default:
      switch(TVar3) {
      case ecvendor_national_instruments:
        return "National Instruments (PortableDAQ)";
      case 0x1fa:
      case 0x1fb:
      case ecvendor_prueftechnik_ndt|ecvendor_etg:
      case 0x200:
      case 0x201:
      case 0x202:
      case 0x203:
      case ecvendor_baumer_th|ecvendor_etg:
      case ecvendor_baumer_th|ecvendor_beckhoff:
        break;
      case ecvendor_fernsteuergeraete_kurt_oelsch:
        return "Fernsteuergeraete Kurt Oelsch GmbH";
      case ecvendor_idam:
        return "INA - Drives & Mechatronics GmbH & Co.oHG (Research & Development)";
      case ecvendor_prueftechnik_ndt:
        return "PRUEFTECHNIK NDT GmbH";
      case ecvendor_baumer_th:
        return "Baumer Thalheim?";
      case ecvendor_esitron_electronic:
        return "esitron-electronic GmbH";
      default:
        switch(TVar3) {
        case ecvendor_jumo:
          return "Juchheim Fulda";
        case ecvendor_jumo|ecvendor_etg:
        case 0x128:
        case 0x12a:
        case 299:
        case 300:
        case 0x12d:
          break;
        case ecvendor_hsd:
          return "HSD S.p.A";
        case ecvendor_lika_electronic:
          return "Lika Electronic SncCSM GmbH";
        case ecvendor_csm:
          return "CSM GmbH";
        default:
          switch(TVar3) {
          case ecvendor_deutschmann:
            return "Deutschmann Automation GmbH & Co. KG";
          case ecvendor_golden:
            return "Golden A/S (Research And Development)";
          case ecvendor_golden|ecvendor_etg:
          case 0x1a0:
          case 0x1a2:
            break;
          case ecvendor_brunner_elektronik:
            return "Brunner Elektronik AG";
          case ecvendor_technosoft:
            return "TECHNOSOFT S.A.";
          default:
            switch(TVar3) {
            case ecvendor_roche_diagnostics:
              return "Roche Diagnostics AG";
            case ecvendor_toshiba_schneider:
              return "Toshiba Schneider Inverter Corporation";
            case ecvendor_bihl_wiedemann:
              return "Bihl-Wiedemann GmbH";
            case ecvendor_trinamic_motion_control:
              return "TRINAMIC Motion Control GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_handtmann) {
              return "Albert Handtmann Maschinenfabrik GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_kollmorgen) {
              return "Kollmorgen Corporation";
            }
            if (TVar3 == ecvendor_parker) {
              return "Parker?";
            }
            if (TVar3 == ecvendor_tigris_electronic) {
              return "Tigris Electronic GmbH";
            }
            if (TVar3 == ecvendor_hilscher) {
              return "Hilscher GmbH";
            }
            if (TVar3 == ecvendor_murrelektronik) {
              return "Murrelektronik GmbH";
            }
            if (TVar3 == ecvendor_bombardier_transportation) {
              return 
              "Bombardier Transportation (Power Converter Solutions) Germany GmbH (PCS Germany)";
            }
            if (TVar3 == ecvendor_komax) {
              return "Komax AG";
            }
            if (TVar3 == ecvendor_sew_eurodrive) {
              return "SEW-EURODRIVE GmbH & Co. (EETB)";
            }
            if (TVar3 == ecvendor_bachmann_electronic) {
              return "Bachmann electronic GmbH";
            }
            if (TVar3 == ecvendor_danaher) {
              return "Danaher Motion GmbH";
            }
            if (TVar3 == ecvendor_woodward_seg) {
              return "Woodward SEG GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_bernecker_rainer_ie) {
              return "Bernecker + Rainer Industrie-Elektronik Ges.m.b.H";
            }
            if (TVar3 == ecvendor_infranor_electronics) {
              return "Infranor Electronics Sas";
            }
            if (TVar3 == ecvendor_omron) {
              return "OMRON Corporation";
            }
            if (TVar3 == ecvendor_gefran) {
              return "Gefran S.P.A.";
            }
            if (TVar3 == ecvendor_elmo_motion) {
              return "Elmo Motion Control Ltd.";
            }
            if (TVar3 == ecvendor_sontheim_industrie_elektronik) {
              return "Sontheim Industrie Elektronik GmbH";
            }
            if (TVar3 == ecvendor_hirschmann_automation) {
              return "Hirschmann Automation and Control GmbH (INET)";
            }
            if (TVar3 == ecvendor_copley) {
              return "Copley Controls, a Division of Analogic Corporation";
            }
            if (TVar3 == ecvendor_pepperl_fuchs) {
              return "Pepperl+Fuchs GmbH";
            }
            if (TVar3 == ecvendor_johannes_huebner) {
              return "Johannes Huebner Fabrik elektrischer Maschinen GmbH";
            }
            if (TVar3 == ecvendor_abb_oy_drives) {
              return "ABB Oy Drives";
            }
            if (TVar3 == ecvendor_stoeber) {
              return "Stoeber Antriebstechnik GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_messung_systems) {
              return "MESSUNG SYSTEMS";
            }
            if (TVar3 == ecvendor_bonfiglioli_vectron) {
              return "BONFIGLIOLI VECTRON GmbH";
            }
            if (TVar3 == ecvendor_phase_motion_control) {
              return "Phase Motion Control SpA";
            }
            if (TVar3 == ecvendor_metronix) {
              return "Metronix Messgeraete und Elektronik GmbH";
            }
            if (TVar3 == ecvendor_ascon) {
              return "Ascon S.p.A. (R&D)";
            }
            if (TVar3 == ecvendor_controltechniques) {
              return "Control Techniques";
            }
            if (TVar3 == ecvendor_maxon_motor) {
              return "Maxon motor";
            }
            if (TVar3 == ecvendor_keba) {
              return "KEBA AG (Product Development - Control)";
            }
            if (TVar3 == ecvendor_wittenstein) {
              return "WITTENSTEIN motion control GmbH";
            }
            if (TVar3 == ecvendor_twk_elektronik) {
              return "TWK-Elektronik GmbH";
            }
            if (TVar3 == ecvendor_psa_elettronica) {
              return "PSA Elettronica di F. Grifa";
            }
            if (TVar3 == ecvendor_smc) {
              return "SMC Corporation";
            }
            if (TVar3 == ecvendor_jvl_industri_elektronik) {
              return "JVL Industri Elektronik A/S";
            }
            if (TVar3 == ecvendor_hottinger_baldwin) {
              return "Hottinger Baldwin Messtechnik GmbH";
            }
            if (TVar3 == ecvendor_leuze_electronic) {
              return "Leuze electronic GmbH + Co. KG";
            }
            if (TVar3 == ecvendor_lpkf_motion_control) {
              return "LPKF Motion & Control GmbH";
            }
            if (TVar3 == ecvendor_imc_messysteme) {
              return "imc Messysteme GmbH";
            }
            if (TVar3 == ecvendor_baumueller) {
              return "Baumueller Nuernberg GmbH";
            }
            if (TVar3 == ecvendor_pneumax) {
              return "Pneumax S.p.A.";
            }
            if (TVar3 == ecvendor_promess) {
              return "Promess Incorporated";
            }
            if (TVar3 == ecvendor_peyer_engineering) {
              return "Peyer Engineering";
            }
            if (TVar3 == ecvendor_robox) {
              return "Robox S.P.A.";
            }
            if (TVar3 == ecvendor_sanyo_denki) {
              return "Sanyo Denki Co., Ltd. (2nd Design Dept. Servo System Div.)";
            }
            if (TVar3 == ecvendor_delta_electronics) {
              return "Delta Electronics, Inc.";
            }
            if (TVar3 == ecvendor_amk) {
              return "AMK GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_systeme_helmholz) {
              return "Systeme Helmholz GmbH (Development)";
            }
            if (TVar3 == ecvendor_pantec) {
              return "Pantec Engineering AG";
            }
            if (TVar3 == ecvendor_abb_stotz_kontakt) {
              return "ABB STOTZ-KONTAKT GmbH (STO-CPD)";
            }
            if (TVar3 == ecvendor_berghof_automationstechnik) {
              return "Berghof Automationstechnik GmbH";
            }
            if (TVar3 == ecvendor_stotz_feinmesstechnik) {
              return "Stotz Feinmesstechnik GmbH";
            }
            if (TVar3 == ecvendor_dunkermotoren) {
              return "Dunkermotoren GmbH";
            }
            if (TVar3 == ecvendor_performance_motion_devices) {
              return "Performance Motion Devices, Inc.";
            }
            if (TVar3 == ecvendor_ingenia_cat) {
              return "INGENIA-CAT, S.L.";
            }
            if (TVar3 == ecvendor_crevis) {
              return "CREVIS Co., Ltd.";
            }
            if (TVar3 == ecvendor_thk) {
              return "THK Co., Ltd.";
            }
            if (TVar3 == ecvendor_digitronic) {
              return "Digitronic Automationsanlagen GmbH";
            }
            if (TVar3 == ecvendor_hanyang) {
              return "HanYang System (Korea)";
            }
            if (TVar3 == ecvendor_baldor_uk) {
              return "Baldor UK Ltd";
            }
            if (TVar3 == ecvendor_tg_drives) {
              return "TG Drives s.r.o.";
            }
            if (TVar3 == ecvendor_schleuniger) {
              return "Schleuniger AG";
            }
            if (TVar3 == ecvendor_renesas) {
              return "Renesas";
            }
            if (TVar3 == ecvendor_koenig) {
              return "Koenig Prozessautomatisierungs gmbH";
            }
            if (TVar3 == ecvendor_shanghai_cnc) {
              return "Shanghai Capital Numerical Control Co., Ltd. (Research and Developement)";
            }
            if (TVar3 == ecvendor_mitsubishi) {
              return 
              "Mitsubishi Electric Corporation (Nagoya Works Marketing dept. Servo system section)";
            }
            if (TVar3 == ecvendor_john_deere) {
              return "John Deere Werke Mannheim";
            }
            if (TVar3 == ecvendor_cantops) {
              return "CanTops";
            }
            if (TVar3 == ecvendor_ids) {
              return "IDS GmbH (Germany)";
            }
            if (TVar3 == ecvendor_adlink) {
              return "ADLINK TECHNOLOGY INC.";
            }
            if (TVar3 == ecvendor_eubus) {
              return "eubus GmbH";
            }
            if (TVar3 == ecvendor_unico) {
              return "Unico Inc.";
            }
            if (TVar3 == ecvendor_dlr) {
              return 
              "DLR Deutsches Zentrum fuer Luft- und Raumfahrt e.V. (Institut fuer Robotik und Mechatronik)"
              ;
            }
            if (TVar3 == ecvendor_hei_canton_de_vaud_reds) {
              return 
              "Haute Ecole d\'Ingenierie et de Gestion du Canton de Vaud du Canton de Vaud (REDS)";
            }
            if (TVar3 == ecvendor_bystorm) {
              return "BySTORM & CO. srl";
            }
            if (TVar3 == ecvendor_ipetronik) {
              return "IPETRONIK GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_sennheiser) {
              return "Sennheiser electronic GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_danieli_automation) {
              return "DANIELI AUTOMATION SPA (HiPAC Platform / Flat Products)";
            }
            if (TVar3 == ecvendor_acontis) {
              return "acontis technologies GmbH";
            }
            if (TVar3 == ecvendor_kuka) {
              return "KUKA Roboter GmbH (Purchasing)";
            }
            if (TVar3 == ecvendor_nat) {
              return "N.A.T. GmbH";
            }
            if (TVar3 == ecvendor_mecapion) {
              return "Mecapion Co., Ltd. (R&D Center)";
            }
            if (TVar3 == ecvendor_ontec) {
              return "ONTEC CO.,LTD (R&D Center)";
            }
            if (TVar3 == ecvendor_foxnum) {
              return "Foxnum Technology Co., Ltd. (Production Department)";
            }
            if (TVar3 == ecvendor_kyoei) {
              return "Kyoei Electronics Co., Ltd. (Systems Technical Sales Department)";
            }
            if (TVar3 == ecvendor_brother) {
              return "Brother Industries Ltd. (Machinery & Solution Company)";
            }
            if (TVar3 == ecvendor_shenyang_machine_tool) {
              return 
              "Shenyang Machine Tool (Group) Design Institute Co., Ltd. (Hardware Design Department)"
              ;
            }
            if (TVar3 == ecvendor_soft_servo) {
              return "Soft Servo Systems, Inc";
            }
            if (TVar3 == ecvendor_vipa) {
              return "VIPA GmbH";
            }
            if (TVar3 == ecvendor_gd) {
              return "G.D SpA (R&D GD3)";
            }
            if (TVar3 == ecvendor_keba_at) {
              return "KEBA AG (AT)";
            }
            if (TVar3 == ecvendor_willow_garage) {
              return "Willow Garage, Inc.";
            }
            if (TVar3 == ecvendor_interroll) {
              return "Interroll Trommelmotoren GmbH (Drummotor)";
            }
            if (TVar3 == ecvendor_silica_avnet) {
              return "Silica, Avnet EMG GmbH";
            }
            if (TVar3 == ecvendor_altima) {
              return "ALTIMA Corp.";
            }
            if (TVar3 == ecvendor_kuhnke) {
              return "Kuhnke Automation GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_jat) {
              return "Jenaer Antriebstechnik GmbH";
            }
            if (TVar3 == ecvendor_heidelberger) {
              return "Heidelberger Druckmaschinen AG";
            }
            if (TVar3 == ecvendor_mecalc) {
              return "Mecalc PTY Limited";
            }
            if (TVar3 == ecvendor_samsung_sec) {
              return "Samsung Electronics Co. Ltd. (Mechatronics & Manufacturing Technology Center)"
              ;
            }
            if (TVar3 == ecvendor_aixcon) {
              return "aixcon PowerSystems GmbH";
            }
            if (TVar3 == ecvendor_kk_electronic) {
              return "KK-electronic a/s";
            }
            if (TVar3 == ecvendor_sick) {
              return "SICK AG (CD R&D)";
            }
            if (TVar3 == ecvendor_parker_hannifin) {
              return "Parker Hannifin SpA";
            }
            if (TVar3 == ecvendor_balluf) {
              return "Balluff GmbH (PC3)";
            }
            if (TVar3 == ecvendor_ma_vi) {
              return "Ma.Vi. srl";
            }
            if (TVar3 == ecvendor_kraeutner_software) {
              return "Kraeutner Software Solutions (Development)";
            }
            if (TVar3 == ecvendor_parker_hannifin_eme) {
              return "Parker Hannifin GmbH - EME (EMD Hauser)";
            }
            if (TVar3 == ecvendor_danfoss_drives) {
              return "Danfoss Drives A/S";
            }
            if (TVar3 == ecvendor_parker_hannifin_eme_630) {
              return "Parker Hannifin GmbH - EME (Automation Group-SSD Drives Europe 630)";
            }
            if (TVar3 == ecvendor_parker_hannifin_ssd) {
              return "Parker Hannifin Ltd. (SSD Drives)";
            }
            if (TVar3 == ecvendor_schneider_motion_control) {
              return "Schneider Electric Motion Deutschland GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_fas) {
              return "FAS Technology Co., Ltd. (network)";
            }
            if (TVar3 == ecvendor_beckhoff_hardware) {
              return "Beckhoff Automation GmbH (Hardware Development)";
            }
            if (TVar3 == ecvendor_hengstler) {
              return "Hengstler GmbH (Germany)";
            }
            if (TVar3 == ecvendor_lenord_bauer) {
              return "Lenord Bauer & Co.GmbH";
            }
            if (TVar3 == ecvendor_ibv) {
              return "IBV - Echtzeit- und Embedded GmbH & Co. KG";
            }
            if (TVar3 == ecvendor_red_one) {
              return "Red one technologies (Institute of Robot research)";
            }
            if (TVar3 == ecvendor_shf_communication) {
              return "SHF Communication Technologies AG";
            }
            if (TVar3 == ecvendor_grossenbacher) {
              return "Grossenbacher Systeme AG";
            }
            if (TVar3 == ecvendor_nti_linmot) {
              return "NTI AG / LinMot (LinMot)";
            }
            if (TVar3 == ecvendor_eltromat) {
              return "Eltromat GmbH (Leopoldshoehe)";
            }
            if (TVar3 == ecvendor_arte_motion) {
              return "Arte Motion S.p.A.";
            }
            if (TVar3 == ecvendor_paul_maschinenfabrik) {
              return "PAUL Maschinenfabrik GmbH & Co.KG (Elektronik)";
            }
          }
        }
      }
    }
switchD_00147e87_caseD_19f:
    bVar1 = 0xdfffffff < TVar3;
    TVar3 = EV & 0x1fffffff;
  } while (bVar1);
  pcVar2 = "----";
switchD_00147e6c_caseD_6:
  return pcVar2;
}

Assistant:

EC_T_CHAR* SlaveVendorText
    (T_eEtherCAT_Vendor EV)       /**< [in]   Vendor ID */
{
    EC_T_CHAR* pRet = EC_NULL;

    switch (EV)
    {
    VENDOR_TEXT(ecvendor_etg,                              "EtherCAT Technology Group");
    VENDOR_TEXT(ecvendor_beckhoff,                         "Beckhoff Automation GmbH");
#if !(defined EC_DEMO_TINY)
    VENDOR_TEXT(ecvendor_scuola_superiore_s_anna,          "Scuola Superiore S. Anna (PERCRO)");
    VENDOR_TEXT(ecvendor_ixxat,                            "IXXAT Automation GmbH");
    VENDOR_TEXT(ecvendor_vector_informatik,                "Vector Informatik GmbH");
    VENDOR_TEXT(ecvendor_knestel,                          "KNESTEL Technologie & Elektronik GmbH (Hardware/Product Development)");
    VENDOR_TEXT(ecvendor_cmz_sistemi,                      "CMZ Sistemi Elettronici");
    VENDOR_TEXT(ecvendor_softing,                          "Softing AG");
    VENDOR_TEXT(ecvendor_microcontrol,                     "MicroControl GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_pollmeier,                        "ESR Pollmeier");
    VENDOR_TEXT(ecvendor_lust,                             "LTI Lust");
    VENDOR_TEXT(ecvendor_kuebler,                          "Fritz Kuebler GmbH");
    VENDOR_TEXT(ecvendor_keb,                              "KEB, Karl E. Brinkmann GmbH");
    VENDOR_TEXT(ecvendor_lti,                              "LTi DRiVES GmbH");
    VENDOR_TEXT(ecvendor_esd_electronic_design,            "esd electronic system design gmbh");
    VENDOR_TEXT(ecvendor_hms_industrial_networks,          "HMS Industrial Networks AB");
    VENDOR_TEXT(ecvendor_epis_automation,                  "epis Automation GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_festo,                            "Festo AG & Co, KG (TV-N)");
    VENDOR_TEXT(ecvendor_wago,                             "WAGO Kontakttechnik GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_boschrexroth,                     "Bosch Rexroth AG");
    VENDOR_TEXT(ecvendor_moog,                             "Moog GmbH");
    VENDOR_TEXT(ecvendor_port,                             "port GmbH");
    VENDOR_TEXT(ecvendor_buerkert_werke,                   "Buerkert Werke GmbH & Co. KG (Development)");
    VENDOR_TEXT(ecvendor_lenze,                            "Lenze Drive Systems GmbH (Lenze AG)");
    VENDOR_TEXT(ecvendor_tigris_electronic,                "Tigris Electronic GmbH");
    VENDOR_TEXT(ecvendor_hilscher,                         "Hilscher GmbH");
    VENDOR_TEXT(ecvendor_murrelektronik,                   "Murrelektronik GmbH");
    VENDOR_TEXT(ecvendor_bombardier_transportation,        "Bombardier Transportation (Power Converter Solutions) Germany GmbH (PCS Germany)");
    VENDOR_TEXT(ecvendor_komax,                            "Komax AG");
    VENDOR_TEXT(ecvendor_sew_eurodrive,                    "SEW-EURODRIVE GmbH & Co. (EETB)");
    VENDOR_TEXT(ecvendor_bachmann_electronic,              "Bachmann electronic GmbH");
    VENDOR_TEXT(ecvendor_danaher,                          "Danaher Motion GmbH");
    VENDOR_TEXT(ecvendor_kollmorgen,                       "Kollmorgen Corporation");
    VENDOR_TEXT(ecvendor_woodward_seg,                     "Woodward SEG GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_bernecker_rainer_ie,              "Bernecker + Rainer Industrie-Elektronik Ges.m.b.H");
    VENDOR_TEXT(ecvendor_infranor_electronics,             "Infranor Electronics Sas");
    VENDOR_TEXT(ecvendor_omron,                            "OMRON Corporation");
    VENDOR_TEXT(ecvendor_gefran,                           "Gefran S.P.A.");
    VENDOR_TEXT(ecvendor_elmo_motion,                      "Elmo Motion Control Ltd.");
    VENDOR_TEXT(ecvendor_sontheim_industrie_elektronik,    "Sontheim Industrie Elektronik GmbH");
    VENDOR_TEXT(ecvendor_hirschmann_automation,            "Hirschmann Automation and Control GmbH (INET)");
    VENDOR_TEXT(ecvendor_copley,                           "Copley Controls, a Division of Analogic Corporation");
    VENDOR_TEXT(ecvendor_pepperl_fuchs,                    "Pepperl+Fuchs GmbH");
    VENDOR_TEXT(ecvendor_johannes_huebner,                 "Johannes Huebner Fabrik elektrischer Maschinen GmbH");
    VENDOR_TEXT(ecvendor_abb_oy_drives,                    "ABB Oy Drives");
    VENDOR_TEXT(ecvendor_stoeber,                          "Stoeber Antriebstechnik GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_messung_systems,                  "MESSUNG SYSTEMS");
    VENDOR_TEXT(ecvendor_bonfiglioli_vectron,              "BONFIGLIOLI VECTRON GmbH");
    VENDOR_TEXT(ecvendor_phase_motion_control,             "Phase Motion Control SpA");
    VENDOR_TEXT(ecvendor_metronix,                         "Metronix Messgeraete und Elektronik GmbH");
    VENDOR_TEXT(ecvendor_ascon,                            "Ascon S.p.A. (R&D)");
    VENDOR_TEXT(ecvendor_controltechniques,                "Control Techniques");
    VENDOR_TEXT(ecvendor_maxon_motor,                      "Maxon motor");
    VENDOR_TEXT(ecvendor_keba,                             "KEBA AG (Product Development - Control)");
    VENDOR_TEXT(ecvendor_wittenstein,                      "WITTENSTEIN motion control GmbH");
    VENDOR_TEXT(ecvendor_twk_elektronik,                   "TWK-Elektronik GmbH");
    VENDOR_TEXT(ecvendor_psa_elettronica,                  "PSA Elettronica di F. Grifa");
    VENDOR_TEXT(ecvendor_smc,                              "SMC Corporation");
    VENDOR_TEXT(ecvendor_jvl_industri_elektronik,          "JVL Industri Elektronik A/S");
    VENDOR_TEXT(ecvendor_hottinger_baldwin,                "Hottinger Baldwin Messtechnik GmbH");
    VENDOR_TEXT(ecvendor_leuze_electronic,                 "Leuze electronic GmbH + Co. KG");
    VENDOR_TEXT(ecvendor_jumo,                             "Juchheim Fulda");
    VENDOR_TEXT(ecvendor_hsd,                              "HSD S.p.A");
    VENDOR_TEXT(ecvendor_lika_electronic,                  "Lika Electronic SncCSM GmbH");
    VENDOR_TEXT(ecvendor_csm,                              "CSM GmbH");
    VENDOR_TEXT(ecvendor_lpkf_motion_control,              "LPKF Motion & Control GmbH");
    VENDOR_TEXT(ecvendor_imc_messysteme,                   "imc Messysteme GmbH");
    VENDOR_TEXT(ecvendor_baumueller,                       "Baumueller Nuernberg GmbH");
    VENDOR_TEXT(ecvendor_pneumax,                          "Pneumax S.p.A.");
    VENDOR_TEXT(ecvendor_promess,                          "Promess Incorporated");
    VENDOR_TEXT(ecvendor_deutschmann,                      "Deutschmann Automation GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_golden,                           "Golden A/S (Research And Development)");
    VENDOR_TEXT(ecvendor_brunner_elektronik,               "Brunner Elektronik AG");
    VENDOR_TEXT(ecvendor_technosoft,                       "TECHNOSOFT S.A.");
    VENDOR_TEXT(ecvendor_peyer_engineering,                "Peyer Engineering");
    VENDOR_TEXT(ecvendor_robox,                            "Robox S.P.A.");
    VENDOR_TEXT(ecvendor_parker,                           "Parker?");
    VENDOR_TEXT(ecvendor_sanyo_denki,                      "Sanyo Denki Co., Ltd. (2nd Design Dept. Servo System Div.)");
    VENDOR_TEXT(ecvendor_delta_electronics,                "Delta Electronics, Inc.");
    VENDOR_TEXT(ecvendor_amk,                              "AMK GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_national_instruments,             "National Instruments (PortableDAQ)");
    VENDOR_TEXT(ecvendor_fernsteuergeraete_kurt_oelsch,    "Fernsteuergeraete Kurt Oelsch GmbH");
    VENDOR_TEXT(ecvendor_idam,                             "INA - Drives & Mechatronics GmbH & Co.oHG (Research & Development)");
    VENDOR_TEXT(ecvendor_prueftechnik_ndt,                 "PRUEFTECHNIK NDT GmbH");
    VENDOR_TEXT(ecvendor_baumer_th,                        "Baumer Thalheim?");
    VENDOR_TEXT(ecvendor_esitron_electronic,               "esitron-electronic GmbH");
    VENDOR_TEXT(ecvendor_systeme_helmholz,                 "Systeme Helmholz GmbH (Development)");
    VENDOR_TEXT(ecvendor_pantec,                           "Pantec Engineering AG");
    VENDOR_TEXT(ecvendor_abb_stotz_kontakt,                "ABB STOTZ-KONTAKT GmbH (STO-CPD)");
    VENDOR_TEXT(ecvendor_berghof_automationstechnik,       "Berghof Automationstechnik GmbH");
    VENDOR_TEXT(ecvendor_stotz_feinmesstechnik,            "Stotz Feinmesstechnik GmbH");
    VENDOR_TEXT(ecvendor_dunkermotoren,                    "Dunkermotoren GmbH");
    VENDOR_TEXT(ecvendor_roche_diagnostics,                "Roche Diagnostics AG");
    VENDOR_TEXT(ecvendor_toshiba_schneider,                "Toshiba Schneider Inverter Corporation");
    VENDOR_TEXT(ecvendor_bihl_wiedemann,                   "Bihl-Wiedemann GmbH");
    VENDOR_TEXT(ecvendor_trinamic_motion_control,          "TRINAMIC Motion Control GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_performance_motion_devices,       "Performance Motion Devices, Inc.");
    VENDOR_TEXT(ecvendor_ingenia_cat,                      "INGENIA-CAT, S.L.");
    VENDOR_TEXT(ecvendor_crevis,                           "CREVIS Co., Ltd.");
    VENDOR_TEXT(ecvendor_thk,                              "THK Co., Ltd.");
    VENDOR_TEXT(ecvendor_digitronic,                       "Digitronic Automationsanlagen GmbH");
    VENDOR_TEXT(ecvendor_hanyang,                          "HanYang System (Korea)");
    VENDOR_TEXT(ecvendor_baldor_uk,                        "Baldor UK Ltd");
    VENDOR_TEXT(ecvendor_beck_ipc,                         "Beck IPC GmbH");
    VENDOR_TEXT(ecvendor_etas,                             "ETAS GmbH");
    VENDOR_TEXT(ecvendor_phytec_messtechnik,               "PHYTEC Messtechnik GmbH");
    VENDOR_TEXT(ecvendor_anca_motion,                      "ANCA Motion Pty. Ltd");
    VENDOR_TEXT(ecvendor_fh_koeln,                         "Fachhochschule Koeln (IME-RT)");
    VENDOR_TEXT(ecvendor_nuvation_research,                "Nuvation Research Corporation");
    VENDOR_TEXT(ecvendor_tr,                               "TR-Electronic");
    VENDOR_TEXT(ecvendor_gantner,                          "Gantner Instruments GmbH");
    VENDOR_TEXT(ecvendor_mks_systems,                      "MKS Instruments (CIT Controls)");
    VENDOR_TEXT(ecvendor_abb_robotics,                     "ABB AB (Robotics)");
    VENDOR_TEXT(ecvendor_unitro_fleischmann,               "Unitro-Fleischmann");
    VENDOR_TEXT(ecvendor_zub_machine_control,              "zub machine control AG");
    VENDOR_TEXT(ecvendor_dspace,                           "dSPACE GmbH");
    VENDOR_TEXT(ecvendor_samsung,                          "Samsung Heavy Industries (Mechatronics Center)");
    VENDOR_TEXT(ecvendor_bce,                              "BCE Elektronik GmbH");
    VENDOR_TEXT(ecvendor_jaeger_messtechnik,               "Jaeger Computergesteuerte Messtechnik GmbH");
    VENDOR_TEXT(ecvendor_tetra,                            "TETRA Gesellschaft fuer Sensorik, Robotik und Automation mbH");
    VENDOR_TEXT(ecvendor_justek,                           "Justek Inc. (Research Lab.)");
    VENDOR_TEXT(ecvendor_baumer_thalheim,                  "Baumer Thalheim GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_elin_ebg_traction,                "Elin EBG Traction GmbH");
    VENDOR_TEXT(ecvendor_meka_robotics,                    "Meka Robotics");
    VENDOR_TEXT(ecvendor_altera_japan,                     "Altera Japan Ltd.");
    VENDOR_TEXT(ecvendor_ebv_elektronik,                   "EBV Elektronik GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_igh,                              "Ingenieurgemeinschaft IgH");
    VENDOR_TEXT(ecvendor_iav,                              "IAV GmbH (MD-E4)");
    VENDOR_TEXT(ecvendor_hitachi,                          "Hitachi Industrial Equipment Systems");
    VENDOR_TEXT(ecvendor_tenasys,                          "TenAsys Corp. (INtime)");
    VENDOR_TEXT(ecvendor_pondis,                           "PONDis AG");
    VENDOR_TEXT(ecvendor_moog_italiana,                    "Moog Italiana S.r.l. (Casella)");
    VENDOR_TEXT(ecvendor_wallner_automation,               "Wallner Automation");
    VENDOR_TEXT(ecvendor_avl_list,                         "AVL List GmbH (PECE)");
    VENDOR_TEXT(ecvendor_ritter_elektronik,                "RITTER-Elektronik GmbH");
    VENDOR_TEXT(ecvendor_zwick,                            "Zwick GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_dresdenelektronik,                "dresden elektronik ingenieurtechnik gmbh");
    VENDOR_TEXT(ecvendor_philips_healthcare,               "Philips Healthcare (CT Division)");
    VENDOR_TEXT(ecvendor_chess,                            "Chess B.V.");
    VENDOR_TEXT(ecvendor_nct,                              "NCT kft");
    VENDOR_TEXT(ecvendor_anywire,                          "Anywire Corporation");
    VENDOR_TEXT(ecvendor_shadow_robot,                     "Shadow Robot Company Ltd.");
    VENDOR_TEXT(ecvendor_fecon,                            "FeCon GmbH");
    VENDOR_TEXT(ecvendor_fh_suedwestfahlen,                "FH Suedwestfalen (LaborEV)");
    VENDOR_TEXT(ecvendor_add2,                             "add2 Ldt");
    VENDOR_TEXT(ecvendor_arm_automation,                   "ARM Automation, Inc.");
    VENDOR_TEXT(ecvendor_knapp_logistik,                   "KNAPP Logistik Automation GmbH (KNAPP AG)");
    VENDOR_TEXT(ecvendor_getriebebau_nord,                 "Getriebebau NORD GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_yaskawa,                          "Yaskawa Electric Corporation (Japan)");
    VENDOR_TEXT(ecvendor_oki,                              "Oki Information Systems Co., Ltd. (Japan)");
    VENDOR_TEXT(ecvendor_takasaki_kyoudou,                 "Takasaki Kyoudou Computing Center Co. (Multimedia and Audio Visual)");
    VENDOR_TEXT(ecvendor_nittetsu_elex,                    "NITTETSU ELEX Co., Ltd. (FA-System)");
    VENDOR_TEXT(ecvendor_unjo,                             "Unjo AB");
    VENDOR_TEXT(ecvendor_eads_deutschland,                 "EADS Deutschland GmbH (Military Air Systems)");
    VENDOR_TEXT(ecvendor_acs_motion_control,               "ACS Motion Control Ltd.");
    VENDOR_TEXT(ecvendor_keyence,                          "KEYENCE Corporation");
    VENDOR_TEXT(ecvendor_mefi,                             "MEFI s.r.o.");
    VENDOR_TEXT(ecvendor_mut,                              "m-u-t AG Messgeraete fuer Medizin- und Umwelttechnik");
    VENDOR_TEXT(ecvendor_isw_uni_stuttgart,                "ISW - Universitaet Stuttgart (Fachbereich C)");
    VENDOR_TEXT(ecvendor_elsena,                           "ELSENA, Inc. (TOKYO)");
    VENDOR_TEXT(ecvendor_be_semiconductor,                 "BE Semiconductor Industries N.V. (Datacon Technology GmbH)");
    VENDOR_TEXT(ecvendor_hauni_lni,                        "Hauni LNI Electronics S.A. (R&D)");
    VENDOR_TEXT(ecvendor_etel,                             "ETEL S.A. (Electronics R&D)");
    VENDOR_TEXT(ecvendor_vat_vakuumventile,                "VAT Vakuumventile AG");
    VENDOR_TEXT(ecvendor_laytec,                           "LayTec GmbH (Research&Development)");
    VENDOR_TEXT(ecvendor_num,                              "NUM AG");
    VENDOR_TEXT(ecvendor_hauni_maschinenbau,               "Hauni Maschinenbau AG");
    VENDOR_TEXT(ecvendor_exatronic,                        "Exatronic, Engenharia Electronica, Lda");
    VENDOR_TEXT(ecvendor_iim_chinese_aos,                  "Institute of Intelligent Machines, Chinese Academy of Sciences");
    VENDOR_TEXT(ecvendor_tu_eindhoven,                     "Eindhoven University of Technology (Mechanical Engineering)");
    VENDOR_TEXT(ecvendor_scansonic,                        "Scansonic MI GmbH");
    VENDOR_TEXT(ecvendor_shanghai_sodick_sw,               "Shanghai Sodick Software Co., Ltd.");
    VENDOR_TEXT(ecvendor_chuo_electronics,                 "CHUO ELECTRONICS CO., LTD");
    VENDOR_TEXT(ecvendor_agie,                             "AGIE SA");
    VENDOR_TEXT(ecvendor_hei_canton_de_vaud,               "Haute Ecoled'Ingenierie et de Gestion du Canton de Vaud (IAI - Institut d'Automatisation Industrielle de la HEIG-VD)");
    VENDOR_TEXT(ecvendor_jenny_science,                    "Jenny Science AG");
    VENDOR_TEXT(ecvendor_industrial_control_communications,"Industrial Control Communications, Inc.");
    VENDOR_TEXT(ecvendor_ckd_elektrotechnika,              "CKD ELEKTROTECHNIKA, a.s. (Electrotechnics)");
    VENDOR_TEXT(ecvendor_qem,                              "QEM S.r.l.");
    VENDOR_TEXT(ecvendor_simatex,                          "Simatex AG (Software)");
    VENDOR_TEXT(ecvendor_kithara,                          "Kithara Software GmbH");
    VENDOR_TEXT(ecvendor_converteam,                       "Converteam GmbH");
    VENDOR_TEXT(ecvendor_ara,                              "Ara apparatenfabriek B.V.");
    VENDOR_TEXT(ecvendor_tata_consultancy,                 "Tata Consultancy Services Ltd. (Abhilash Embedded)");
    VENDOR_TEXT(ecvendor_tiab,                             "Tiab Limited");
    VENDOR_TEXT(ecvendor_rkc_instrument,                   "RKC INSTRUMENT INC.");
    VENDOR_TEXT(ecvendor_switched_reluctance,              "Switched Reluctance Drives Ltd. (Development)");
    VENDOR_TEXT(ecvendor_avnet_electronics,                "Avnet Electronics Marketing");
    VENDOR_TEXT(ecvendor_abb_force_measurement,            "ABB AB (Force Measurement)");
    VENDOR_TEXT(ecvendor_kunbus,                           "KUNBUS GmbH");
    VENDOR_TEXT(ecvendor_acd_antriebstechnik,              "ACD Antriebstechnik GmbH");
    VENDOR_TEXT(ecvendor_bronkhorst,                       "Bronkhorst High-Tech B.V.");
    VENDOR_TEXT(ecvendor_k_mecs,                           "K.MECS Co., Ltd. (Engineering Dept.)");
    VENDOR_TEXT(ecvendor_thomson_broadcast,                "Thomson Broadcast & Multimedia AG");
    VENDOR_TEXT(ecvendor_ufg_elettronica,                  "UFG Elettronica s.r.l. (Manufacturing)");
    VENDOR_TEXT(ecvendor_xilinx,                           "Xilinx Ireland (Xilinx Design Services)");
    VENDOR_TEXT(ecvendor_abb_power_systems,                "ABB AB (Power Systems)");
    VENDOR_TEXT(ecvendor_servoland,                        "Servoland Corporation");
    VENDOR_TEXT(ecvendor_hivertec,                         "Hivertec, Inc.");
    VENDOR_TEXT(ecvendor_fike_europe,                      "Fike Europe B.v.b.a.");
    VENDOR_TEXT(ecvendor_ropex,                            "ROPEX Industrie-Elektronik GmbH");
    VENDOR_TEXT(ecvendor_tlu,                              "TLU - Thueringer Leistungselektronik Union GmbH");
    VENDOR_TEXT(ecvendor_prodrive,                         "Prodrive B.V.");
    VENDOR_TEXT(ecvendor_miho_inspektionssysteme,          "miho Inspektionssysteme GmbH");
    VENDOR_TEXT(ecvendor_tokyo_electron,                   "Tokyo Electron Device Limited (PLD)");
    VENDOR_TEXT(ecvendor_lintec,                           "LINTEC CO., LTD. (Design Division2)");
    VENDOR_TEXT(ecvendor_simplex_vision,                   "Symplex Vision Systems GmbH");
    VENDOR_TEXT(ecvendor_sus,                              "SUS Corporation");
    VENDOR_TEXT(ecvendor_trsystems,                        "TRsystems GmbH (Systembereich Unidor)");
    VENDOR_TEXT(ecvendor_harmonic_drive,                   "Harmonic Drive AG");
    VENDOR_TEXT(ecvendor_staeubli_faverges,                "Staeubli Faverges SCA (Robotics)");
    VENDOR_TEXT(ecvendor_scienlab_electronic,              "ScienLab electronic systems GmbH");
    VENDOR_TEXT(ecvendor_fujisoft,                         "FUJISOFT Incorporated (Atsugi Office)");
    VENDOR_TEXT(ecvendor_iai_corporation,                  "IAI Corporation");
    VENDOR_TEXT(ecvendor_promavtomatika,                   "PromAvtomatika");
    VENDOR_TEXT(ecvendor_kistler_instrumente,              "Kistler Instrumente AG");
    VENDOR_TEXT(ecvendor_lauda_wobser,                     "LAUDA DR. R. WOBSER GmbH & Co. KG (Development / Construction)");
    VENDOR_TEXT(ecvendor_schweitzer_engineering_labs,      "Schweitzer Engineering Laboratories, Inc.");
    VENDOR_TEXT(ecvendor_mutracx,                          "Mutracx B.V.");
    VENDOR_TEXT(ecvendor_algo,                             "Algo System Co., Ltd.");
    VENDOR_TEXT(ecvendor_muehlbauer,                       "Muehlbauer AG (Construction of special-purpose machines)");
    VENDOR_TEXT(ecvendor_sealevel_systems,                 "Sealevel Systems, Inc.");
    VENDOR_TEXT(ecvendor_igm_robotersysteme,               "igm Robotersysteme AG");
    VENDOR_TEXT(ecvendor_zbe,                              "ZBE Inc.");
    VENDOR_TEXT(ecvendor_schneider_electric,               "Schneider Electric Power Drives GmbH");
    VENDOR_TEXT(ecvendor_fraunhofer_iosb_ina,              "Fraunhofer IOSB-INA Kompetenzzentrum Industrial Automation");
    VENDOR_TEXT(ecvendor_skf_magnetic_bearings,            "SKF Magnetic Bearings");
    VENDOR_TEXT(ecevndor_galil_motion_control,             "Galil Motion Control Inc.");
    VENDOR_TEXT(ecvendor_ihi,                              "IHI Corporation (Yokohama Engineering Center)");
    VENDOR_TEXT(ecvendor_wenglor_sensoric,                 "wenglor sensoric gmbh");
    VENDOR_TEXT(ecvendor_ingeteam,                         "Ingeteam Technology S.A.");
    VENDOR_TEXT(ecvendor_micro_vu,                         "Micro-Vu Corporation");
    VENDOR_TEXT(ecvendor_oehri_electronic,                 "oehri electronic ag");
    VENDOR_TEXT(ecvendor_nagano_oki,                       "Nagano Oki Electric Co., Ltd.");
    VENDOR_TEXT(ecvendor_condalo,                          "Condalo GmbH");
    VENDOR_TEXT(ecvendor_tg_drives,                        "TG Drives s.r.o.");
    VENDOR_TEXT(ecvendor_schleuniger,                      "Schleuniger AG");
    VENDOR_TEXT(ecvendor_renesas,                          "Renesas");
    VENDOR_TEXT(ecvendor_koenig,                           "Koenig Prozessautomatisierungs gmbH");
    VENDOR_TEXT(ecvendor_shanghai_cnc,                     "Shanghai Capital Numerical Control Co., Ltd. (Research and Developement)");
    VENDOR_TEXT(ecvendor_mitsubishi,                       "Mitsubishi Electric Corporation (Nagoya Works Marketing dept. Servo system section)");
    VENDOR_TEXT(ecvendor_john_deere,                       "John Deere Werke Mannheim");
    VENDOR_TEXT(ecvendor_cantops,                          "CanTops");
    VENDOR_TEXT(ecvendor_ids,                              "IDS GmbH (Germany)");
    VENDOR_TEXT(ecvendor_adlink,                           "ADLINK TECHNOLOGY INC.");
    VENDOR_TEXT(ecvendor_eubus,                            "eubus GmbH");
    VENDOR_TEXT(ecvendor_unico,                            "Unico Inc.");
    VENDOR_TEXT(ecvendor_dlr,                              "DLR Deutsches Zentrum fuer Luft- und Raumfahrt e.V. (Institut fuer Robotik und Mechatronik)");
    VENDOR_TEXT(ecvendor_hei_canton_de_vaud_reds,          "Haute Ecole d'Ingenierie et de Gestion du Canton de Vaud du Canton de Vaud (REDS)");
    VENDOR_TEXT(ecvendor_bystorm,                          "BySTORM & CO. srl");
    VENDOR_TEXT(ecvendor_ipetronik,                        "IPETRONIK GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_sennheiser,                       "Sennheiser electronic GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_danieli_automation,               "DANIELI AUTOMATION SPA (HiPAC Platform / Flat Products)");
    VENDOR_TEXT(ecvendor_acontis,                          "acontis technologies GmbH");
    VENDOR_TEXT(ecvendor_kuka,                             "KUKA Roboter GmbH (Purchasing)");
    VENDOR_TEXT(ecvendor_nat,                              "N.A.T. GmbH");
    VENDOR_TEXT(ecvendor_mecapion,                         "Mecapion Co., Ltd. (R&D Center)");
    VENDOR_TEXT(ecvendor_ontec,                            "ONTEC CO.,LTD (R&D Center)");
    VENDOR_TEXT(ecvendor_foxnum,                           "Foxnum Technology Co., Ltd. (Production Department)");
    VENDOR_TEXT(ecvendor_kyoei,                            "Kyoei Electronics Co., Ltd. (Systems Technical Sales Department)");
    VENDOR_TEXT(ecvendor_brother,                          "Brother Industries Ltd. (Machinery & Solution Company)");
    VENDOR_TEXT(ecvendor_shenyang_machine_tool,            "Shenyang Machine Tool (Group) Design Institute Co., Ltd. (Hardware Design Department)");
    VENDOR_TEXT(ecvendor_soft_servo,                       "Soft Servo Systems, Inc");
    VENDOR_TEXT(ecvendor_vipa,                             "VIPA GmbH");
    VENDOR_TEXT(ecvendor_gd,                               "G.D SpA (R&D GD3)");
    VENDOR_TEXT(ecvendor_keba_at,                          "KEBA AG (AT)");
    VENDOR_TEXT(ecvendor_willow_garage,                    "Willow Garage, Inc.");
    VENDOR_TEXT(ecvendor_interroll,                        "Interroll Trommelmotoren GmbH (Drummotor)");
    VENDOR_TEXT(ecvendor_silica_avnet,                     "Silica, Avnet EMG GmbH");
    VENDOR_TEXT(ecvendor_altima,                           "ALTIMA Corp.");
    VENDOR_TEXT(ecvendor_kuhnke,                           "Kuhnke Automation GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_jat,                              "Jenaer Antriebstechnik GmbH");
    VENDOR_TEXT(ecvendor_heidelberger,                     "Heidelberger Druckmaschinen AG");
    VENDOR_TEXT(ecvendor_mecalc,                           "Mecalc PTY Limited");
    VENDOR_TEXT(ecvendor_samsung_sec,                      "Samsung Electronics Co. Ltd. (Mechatronics & Manufacturing Technology Center)");
    VENDOR_TEXT(ecvendor_aixcon,                           "aixcon PowerSystems GmbH");
    VENDOR_TEXT(ecvendor_kk_electronic,                    "KK-electronic a/s");
    VENDOR_TEXT(ecvendor_sick,                             "SICK AG (CD R&D)");
    VENDOR_TEXT(ecvendor_parker_hannifin,                  "Parker Hannifin SpA");
    VENDOR_TEXT(ecvendor_balluf,                           "Balluff GmbH (PC3)");
    VENDOR_TEXT(ecvendor_ma_vi,                            "Ma.Vi. srl");
    VENDOR_TEXT(ecvendor_kraeutner_software,               "Kraeutner Software Solutions (Development)");
    VENDOR_TEXT(ecvendor_parker_hannifin_eme,              "Parker Hannifin GmbH - EME (EMD Hauser)");
    VENDOR_TEXT(ecvendor_danfoss_drives,                   "Danfoss Drives A/S");
    VENDOR_TEXT(ecvendor_parker_hannifin_eme_630,          "Parker Hannifin GmbH - EME (Automation Group-SSD Drives Europe 630)");
    VENDOR_TEXT(ecvendor_parker_hannifin_ssd,              "Parker Hannifin Ltd. (SSD Drives)");
    VENDOR_TEXT(ecvendor_schneider_motion_control,         "Schneider Electric Motion Deutschland GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_fas,                              "FAS Technology Co., Ltd. (network)");
    VENDOR_TEXT(ecvendor_beckhoff_hardware,                "Beckhoff Automation GmbH (Hardware Development)");
    VENDOR_TEXT(ecvendor_hengstler,                        "Hengstler GmbH (Germany)");
    VENDOR_TEXT(ecvendor_lenord_bauer,                     "Lenord Bauer & Co.GmbH");
    VENDOR_TEXT(ecvendor_ibv,                              "IBV - Echtzeit- und Embedded GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_red_one,                          "Red one technologies (Institute of Robot research)");
    VENDOR_TEXT(ecvendor_shf_communication,                "SHF Communication Technologies AG");
    VENDOR_TEXT(ecvendor_grossenbacher,                    "Grossenbacher Systeme AG");
    VENDOR_TEXT(ecvendor_nti_linmot,                       "NTI AG / LinMot (LinMot)");
    VENDOR_TEXT(ecvendor_eltromat,                         "Eltromat GmbH (Leopoldshoehe)");
    VENDOR_TEXT(ecvendor_arte_motion,                      "Arte Motion S.p.A.");
    VENDOR_TEXT(ecvendor_paul_maschinenfabrik,             "PAUL Maschinenfabrik GmbH & Co.KG (Elektronik)");
    VENDOR_TEXT(ecvendor_handtmann,                        "Albert Handtmann Maschinenfabrik GmbH & Co. KG");
#endif /*#if !(defined EC_DEMO_TINY)*/
    default:
        if (0xE0000000 == (((EC_T_DWORD)EV)&0xE0000000))
        {
            pRet = SlaveVendorText((T_eEtherCAT_Vendor)(((EC_T_DWORD)EV)&(~0xE0000000)));
        }
        else
        {
            pRet = (EC_T_CHAR*)"----";
        }
    }

    return pRet;
}